

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::writeCodesOfSymbols(BMP *this,typeOfCode type,ofstream *out)

{
  ostream *poVar1;
  ofstream *poVar2;
  long lVar3;
  GreyCount *pGVar4;
  long lStack_e0;
  string title;
  GreyCount local_b8;
  
  title._M_dataplus._M_p = (pointer)&title.field_2;
  title._M_string_length = 0;
  title.field_2._M_local_buf[0] = '\0';
  if (type < (SHANNON|HUFFMAN)) {
    std::__cxx11::string::assign((char *)&title);
  }
  poVar2 = out;
  if (out == (ofstream *)0x0) {
    poVar2 = (ofstream *)&std::cout;
  }
  std::operator<<((ostream *)poVar2,(string *)&title);
  pGVar4 = this->alphabet->symbol;
  lVar3 = (long)this->alphabet->num << 7;
  do {
    if (lVar3 == 0) {
      std::__cxx11::string::~string((string *)&title);
      return;
    }
    bitMap::GreyCount::GreyCount(&local_b8,pGVar4);
    if (type == UNIFORM) {
      lStack_e0 = 0x20;
LAB_0010343f:
      poVar1 = (ostream *)&std::cout;
      if (out != (ofstream *)0x0) {
        poVar1 = (ostream *)out;
      }
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)local_b8.tone);
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = std::operator<<(poVar1,(string *)((long)&local_b8.num + lStack_e0));
      std::operator<<(poVar1,'\n');
    }
    else {
      if (type == HUFFMAN) {
        lStack_e0 = 0x60;
        goto LAB_0010343f;
      }
      if (type == SHANNON) {
        lStack_e0 = 0x40;
        goto LAB_0010343f;
      }
    }
    bitMap::GreyCount::~GreyCount(&local_b8);
    pGVar4 = pGVar4 + 1;
    lVar3 = lVar3 + -0x80;
  } while( true );
}

Assistant:

void BMP::writeCodesOfSymbols(  typeOfCode type, std::ofstream *out ) {
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    string title;

    switch( type ){
        case SHANNON:
            title = "Shannon's Code of symbols: \n";
            break;
        case UNIFORM:
            title = "Uniform Code of symbols: \n";
            break;
        case HUFFMAN:
            title = "Huffman's Code of symbols: \n";
            break;
    }

    if ( flag ) {
        (*out) << title;
    } else{
        cout << title;
    }

    for_each(alphabet->symbol, alphabet->symbol+alphabet->num, [&](bitMap::GreyCount a) {
        switch (type) {
            case SHANNON:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.codeShannonFano << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.codeShannonFano << '\n';
                }
                break;
            case UNIFORM:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.uniformCodes << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.uniformCodes << '\n';
                };
                break;
            case HUFFMAN:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.codeHuffman << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.codeHuffman << '\n';
                }
                break;
        }
    });
}